

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nukedopl3.cpp
# Opt level: O2

void chan_writeb0(opl_channel *channel,Bit8u data)

{
  opl_channel *poVar1;
  byte bVar2;
  uint uVar3;
  
  if ((channel->chip->newm == '\0') || (channel->chtype != '\x02')) {
    uVar3 = (data & 3) << 8 | (uint)(byte)channel->f_num;
    channel->f_num = (Bit16u)uVar3;
    bVar2 = data >> 2 & 7;
    channel->block = bVar2;
    channel->ksv = (uVar3 >> ((byte)(9 - channel->chip->nts) & 0x1f) & 1) != 0 | bVar2 * '\x02';
    envelope_update_ksl(channel->slots[0]);
    envelope_update_ksl(channel->slots[1]);
    envelope_update_rate(channel->slots[0]);
    envelope_update_rate(channel->slots[1]);
    if ((channel->chip->newm != '\0') && (channel->chtype == '\x01')) {
      poVar1 = channel->pair;
      poVar1->f_num = channel->f_num;
      poVar1->block = channel->block;
      poVar1->ksv = channel->ksv;
      envelope_update_ksl(poVar1->slots[0]);
      envelope_update_ksl(channel->pair->slots[1]);
      envelope_update_rate(channel->pair->slots[0]);
      envelope_update_rate(channel->pair->slots[1]);
      return;
    }
  }
  return;
}

Assistant:

void chan_writeb0(opl_channel *channel, Bit8u data) {
	if (channel->chip->newm && channel->chtype == ch_4op2) {
		return;
	}
	channel->f_num = (channel->f_num & 0xff) | ((data & 0x03) << 8);
	channel->block = (data >> 2) & 0x07;
	channel->ksv = (channel->block << 1) | ((channel->f_num >> (0x09 - channel->chip->nts)) & 0x01);
	envelope_update_ksl(channel->slots[0]);
	envelope_update_ksl(channel->slots[1]);
	envelope_update_rate(channel->slots[0]);
	envelope_update_rate(channel->slots[1]);
	if (channel->chip->newm && channel->chtype == ch_4op) {
		channel->pair->f_num = channel->f_num;
		channel->pair->block = channel->block;
		channel->pair->ksv = channel->ksv;
		envelope_update_ksl(channel->pair->slots[0]);
		envelope_update_ksl(channel->pair->slots[1]);
		envelope_update_rate(channel->pair->slots[0]);
		envelope_update_rate(channel->pair->slots[1]);
	}
}